

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

int __thiscall
asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::close
          (basic_socket<asio::ip::tcp,_asio::any_io_executor> *this,int __fd)

{
  int extraout_EAX;
  service_type *psVar1;
  implementation_type *piVar2;
  undefined1 local_20 [8];
  error_code ec;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *this_local;
  
  ec._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)local_20);
  psVar1 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(&this->impl_);
  piVar2 = detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_implementation(&this->impl_);
  detail::reactive_socket_service_base::close
            (&psVar1->super_reactive_socket_service_base,(int)piVar2);
  detail::throw_error((error_code *)local_20,"close");
  return extraout_EAX;
}

Assistant:

void close()
  {
    asio::error_code ec;
    impl_.get_service().close(impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "close");
  }